

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

void av1_first_pass_row(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int unit_row,
                       BLOCK_SIZE fp_block_size)

{
  buf_2d *pbVar1;
  undefined1 *puVar2;
  uint8_t uVar3;
  byte bVar4;
  _Bool _Var5;
  uint8_t uVar6;
  byte bVar7;
  byte bVar8;
  aom_bit_depth_t aVar9;
  SequenceHeader *pSVar10;
  YV12_BUFFER_CONFIG *src;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [14];
  undefined1 auVar19 [16];
  AV1_COMP *pAVar20;
  BLOCK_SIZE BVar21;
  short sVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  RefCntBuffer *pRVar29;
  tran_low_t **pptVar30;
  MB_MODE_INFO **ppMVar31;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **pp_Var32;
  int64_t iVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  uint16_t *puVar38;
  uint uVar39;
  uint mi_row;
  long lVar40;
  uint16_t *puVar41;
  byte bVar42;
  int iVar43;
  undefined7 in_register_00000081;
  MB_MODE_INFO *pMVar44;
  bool bVar45;
  byte bVar46;
  int iVar47;
  int iVar48;
  uint mi_col;
  int iVar49;
  MV MVar50;
  int iVar51;
  FRAME_STATS *pFVar52;
  double dVar53;
  ushort uVar54;
  short sVar55;
  short sVar61;
  short sVar62;
  double dVar56;
  short sVar64;
  undefined1 auVar57 [16];
  short sVar63;
  undefined1 auVar58 [16];
  int gf_motion_error;
  AV1_COMP *local_1a0;
  FRAME_STATS *local_198;
  uint local_190;
  uint local_18c;
  int local_188;
  int local_184;
  MV local_180;
  int tmp_err;
  int motion_error;
  FULLPEL_MV mv;
  int local_150;
  int local_124;
  int local_11c;
  MV local_114;
  ulong local_110;
  YV12_BUFFER_CONFIG *local_108;
  YV12_BUFFER_CONFIG *local_100;
  undefined1 local_f8 [16];
  MACROBLOCKD *local_e0;
  RefCntBuffer *local_d8;
  buf_2d *local_d0;
  long local_c8;
  uint local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8;
  int local_a4;
  buf_2d *local_a0;
  ulong local_98;
  AV1_COMMON *local_90;
  CommonModeInfoParams *mi_params;
  AV1EncRowMultiThreadSync *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int *local_58;
  buf_2d unscaled_last_source_buf_2d;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  pSVar10 = (cpi->common).seq_params;
  uVar3 = pSVar10->monochrome;
  iVar23 = av1_find_qindex(10.0,pSVar10->bit_depth,0,0xff);
  uVar35 = CONCAT71(in_register_00000081,fp_block_size) & 0xffffffff;
  local_110 = (ulong)block_size_high[uVar35];
  local_190 = (uint)block_size_wide[uVar35];
  bVar4 = ""[uVar35];
  iVar51 = (cpi->common).mi_params.mb_cols;
  uVar39 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar35];
  uVar24 = (tile_data->tile_info).mi_col_start;
  local_18c = (uint)""[uVar35];
  iVar48 = (tile_data->tile_info).mi_row_start >> (""[uVar35] & 0x1f);
  local_98 = (ulong)(uint)((int)uVar24 >> (bVar4 & 0x1f));
  local_188 = (int)(~uVar24 + (1 << (bVar4 & 0x1f)) + (tile_data->tile_info).mi_col_end) >>
              (bVar4 & 0x1f);
  local_108 = av1_get_scaled_ref_frame(cpi,1);
  if (local_108 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar28 = (long)(cpi->common).remapped_ref_idx[0];
    if (lVar28 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar28];
    }
    local_108 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      local_108 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  iVar49 = (uint)(uVar3 == '\0') * 2 + 1;
  local_100 = av1_get_scaled_ref_frame(cpi,4);
  if (local_100 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar28 = (long)(cpi->common).remapped_ref_idx[3];
    if (lVar28 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar28];
    }
    local_100 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      local_100 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  local_90 = &cpi->common;
  mi_params = &(cpi->common).mi_params;
  iVar34 = unit_row - iVar48;
  local_80 = &tile_data->row_mt_sync;
  local_d8 = (cpi->common).cur_frame;
  pFVar52 = (cpi->firstpass_data).mb_stats;
  local_198 = (FRAME_STATS *)(long)(((iVar51 << 2) / (int)uVar39) * unit_row);
  local_11c = (int)local_98;
  lVar28 = (long)(int)local_98;
  local_58 = (cpi->firstpass_data).raw_motion_err_list + (long)local_198 + lVar28;
  pptVar30 = td->firstpass_ctx->coeff;
  uVar37 = 0;
  do {
    *(tran_low_t **)((long)&(td->mb).plane[0].coeff + uVar37) = *pptVar30;
    *(tran_low_t **)((long)&(td->mb).plane[0].qcoeff + uVar37) = pptVar30[3];
    *(tran_low_t **)((long)&(td->mb).plane[0].eobs + uVar37) = pptVar30[9];
    *(tran_low_t **)((long)&(td->mb).plane[0].txb_entropy_ctx + uVar37) = pptVar30[0xc];
    *(tran_low_t **)((long)&(td->mb).plane[0].dqcoeff + uVar37) = pptVar30[6];
    pptVar30 = pptVar30 + 1;
    uVar37 = uVar37 + 0x88;
  } while ((uint)(iVar49 * 0x88) != uVar37);
  src = cpi->source;
  local_184 = (src->field_4).field_0.y_stride;
  iVar51 = (local_d8->buf).field_4.field_0.y_stride;
  iVar27 = (local_d8->buf).field_4.field_0.uv_stride;
  uVar24 = local_190 >>
           ((local_d8->buf).field_1.field_0.uv_height < (local_d8->buf).field_1.field_0.y_height);
  (td->mb).e_mbd.up_available = unit_row != iVar48;
  iVar36 = unit_row << ((byte)local_18c & 0x1f);
  iVar48 = (cpi->oxcf).border_in_pixels;
  iVar43 = 8 - (iVar48 + iVar36 * 4);
  iVar47 = (iVar36 + (local_190 >> 2)) * -4 + -8;
  if (iVar47 < iVar43) {
    iVar47 = iVar43;
  }
  (td->mb).mv_limits.row_min = iVar47;
  iVar43 = (cpi->common).mi_params.mi_rows - iVar36;
  iVar47 = iVar48 + (iVar43 - (local_190 >> 2)) * 4 + -8;
  iVar48 = iVar43 * 4 + 8;
  if (iVar47 < iVar48) {
    iVar48 = iVar47;
  }
  (td->mb).mv_limits.row_max = iVar48;
  local_1a0 = cpi;
  av1_setup_src_planes(&td->mb,src,iVar36,(tile_data->tile_info).mi_col_start,iVar49,fp_block_size);
  memset((td->mb).plane[0].src_diff,0,0x200);
  if (0 < local_188) {
    pFVar52 = pFVar52 + (long)local_198;
    local_198 = pFVar52 + lVar28;
    local_150 = (iVar27 * unit_row + local_11c) * uVar24;
    local_11c = local_11c * (int)local_110;
    local_184 = local_184 * local_190 * unit_row + local_11c;
    local_11c = local_190 * unit_row * iVar51 + local_11c;
    local_e0 = &(td->mb).e_mbd;
    mi_row = uVar39 * unit_row;
    local_a4 = mi_row * -0x20;
    local_bc = mi_row - 1;
    local_a8 = (uint)(iVar23 == 0);
    local_c0 = (uint)((byte)((local_110 & 0xffffffff) >> 3) & 0x1f);
    local_60 = 0x14fe80L >> ((byte)uVar35 & 0x3f);
    local_b8 = 2 - local_18c;
    local_68 = 0x28ff00L >> ((byte)uVar35 & 0x3f);
    local_18c = local_18c - 2;
    local_b4 = 2 - (uint)bVar4;
    local_d0 = (td->mb).e_mbd.plane[0].pre;
    local_70 = (ulong)(byte)((byte)local_190 >> 2);
    local_a0 = &(td->mb).plane[0].src;
    local_f8 = ZEXT816(0);
    local_78 = (ulong)uVar24;
    local_124 = 0;
    iVar23 = 0;
    iVar51 = local_188;
    local_190 = local_190 >> 3;
    do {
      MVar50 = SUB84(pFVar52,0);
      (*(cpi->mt_info).enc_row_mt.sync_read_ptr)(local_80,iVar34,iVar23);
      if ((cpi->ppi->p_mt_info).num_workers < 2) {
LAB_001c6dc4:
        if (iVar23 == 0) {
          MVar50 = tile_data->firstpass_top_mv;
        }
        iVar48 = iVar23 + (int)local_98;
        pSVar10 = (cpi->common).seq_params;
        uVar6 = pSVar10->monochrome;
        local_180 = MVar50;
        BVar21 = get_bsize(mi_params,fp_block_size,unit_row,iVar48);
        pAVar20 = local_1a0;
        mi_col = iVar48 * uVar39;
        iVar51 = (cpi->common).mi_params.mi_stride;
        iVar49 = iVar51 * mi_row + mi_col;
        (cpi->common).mi_params.mi_grid_base[iVar49] =
             (cpi->common).mi_params.mi_alloc +
             (((int)mi_row /
              (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [(cpi->common).mi_params.mi_alloc_bsize]) *
              (cpi->common).mi_params.mi_alloc_stride +
             (int)mi_col /
             (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [(cpi->common).mi_params.mi_alloc_bsize]);
        ppMVar31 = (cpi->common).mi_params.mi_grid_base + iVar49;
        (td->mb).e_mbd.mi = ppMVar31;
        (td->mb).e_mbd.tx_type_map = (cpi->common).mi_params.tx_type_map + iVar49;
        (td->mb).e_mbd.tx_type_map_stride = iVar51;
        local_c8 = (long)local_11c;
        (td->mb).e_mbd.plane[0].dst.buf = (local_d8->buf).field_5.buffers[0] + local_c8;
        if (uVar6 == '\0') {
          (td->mb).e_mbd.plane[1].dst.buf = (local_d8->buf).field_5.buffers[1] + local_150;
          (td->mb).e_mbd.plane[2].dst.buf = (local_d8->buf).field_5.buffers[2] + local_150;
        }
        (td->mb).e_mbd.left_available = iVar48 != 0;
        pMVar44 = *ppMVar31;
        pMVar44->bsize = BVar21;
        pMVar44->ref_frame[0] = '\0';
        uVar35 = (ulong)BVar21;
        bVar7 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar35]
        ;
        bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar35]
        ;
        iVar51 = (cpi->common).mi_params.mi_rows;
        iVar49 = (cpi->common).mi_params.mi_cols;
        (td->mb).e_mbd.mb_to_top_edge = local_a4;
        (td->mb).e_mbd.mb_to_bottom_edge = ((iVar51 - mi_row) - (uint)bVar7) * 0x20;
        (td->mb).e_mbd.mb_to_left_edge = mi_col * -0x20;
        (td->mb).e_mbd.mb_to_right_edge = (iVar49 - (mi_col + bVar8)) * 0x20;
        (td->mb).e_mbd.mi_row = mi_row;
        (td->mb).e_mbd.mi_col = mi_col;
        iVar51 = (tile_data->tile_info).mi_row_start;
        (td->mb).e_mbd.up_available = iVar51 < (int)mi_row;
        uVar25 = (td->mb).e_mbd.plane[1].subsampling_x;
        uVar26 = (td->mb).e_mbd.plane[1].subsampling_y;
        iVar49 = (tile_data->tile_info).mi_col_start;
        (td->mb).e_mbd.chroma_up_available = iVar51 < (int)mi_row;
        (td->mb).e_mbd.left_available = iVar49 < (int)mi_col;
        bVar45 = iVar49 < (int)(mi_col - 1);
        if (uVar25 == 0) {
          bVar45 = iVar49 < (int)mi_col;
        }
        if ((0x3efffcUL >> (uVar35 & 0x3f) & 1) != 0) {
          bVar45 = iVar49 < (int)mi_col;
        }
        (td->mb).e_mbd.chroma_left_available = bVar45;
        if ((0x20005UL >> (uVar35 & 0x3f) & 1) != 0 && uVar26 != 0) {
          (td->mb).e_mbd.chroma_up_available = iVar51 < local_bc;
        }
        if (iVar51 < (int)mi_row) {
          (td->mb).e_mbd.above_mbmi = (td->mb).e_mbd.mi[-(long)(td->mb).e_mbd.mi_stride];
        }
        else {
          (td->mb).e_mbd.above_mbmi = (MB_MODE_INFO *)0x0;
        }
        if (iVar49 < (int)mi_col) {
          (td->mb).e_mbd.left_mbmi = (td->mb).e_mbd.mi[-1];
        }
        else {
          (td->mb).e_mbd.left_mbmi = (MB_MODE_INFO *)0x0;
        }
        if (((mi_row & 1) == 0) && ((bVar7 & uVar26 != 0) != 0)) {
          (td->mb).e_mbd.is_chroma_ref = false;
        }
        else {
          if (((mi_col & 1) == 0) && ((bVar8 & 1) != 0)) {
            (td->mb).e_mbd.is_chroma_ref = uVar25 == 0;
            if (uVar25 != 0) goto LAB_001c7158;
          }
          else {
            (td->mb).e_mbd.is_chroma_ref = true;
          }
          iVar51 = (td->mb).e_mbd.mi_stride;
          iVar49 = (uVar25 & mi_col) + (uVar26 & mi_row) * iVar51;
          ppMVar31 = (td->mb).e_mbd.mi;
          if ((td->mb).e_mbd.chroma_up_available == true) {
            pMVar44 = ppMVar31[(long)-iVar49 + (long)(int)(uVar25 - iVar51)];
          }
          else {
            pMVar44 = (MB_MODE_INFO *)0x0;
          }
          (td->mb).e_mbd.chroma_above_mbmi = pMVar44;
          if (bVar45 == false) {
            pMVar44 = (MB_MODE_INFO *)0x0;
          }
          else {
            pMVar44 = ppMVar31[(long)-iVar49 + (long)(int)(iVar51 * uVar26) + -1];
          }
          (td->mb).e_mbd.chroma_left_mbmi = pMVar44;
        }
LAB_001c7158:
        (td->mb).e_mbd.height = bVar7;
        (td->mb).e_mbd.width = bVar8;
        (td->mb).e_mbd.is_last_vertical_rect = false;
        if ((bVar8 < bVar7) && ((mi_col + bVar8 & bVar7 - 1) == 0)) {
          (td->mb).e_mbd.is_last_vertical_rect = true;
        }
        (td->mb).e_mbd.is_first_horizontal_rect = false;
        if ((bVar7 < bVar8) && ((bVar8 - 1 & mi_row) == 0)) {
          (td->mb).e_mbd.is_first_horizontal_rect = true;
        }
        lVar28 = 0xa30;
        if (uVar6 == '\0') {
          lVar28 = 0x1e90;
        }
        lVar40 = 0;
        do {
          bVar42 = (byte)(((uint)bVar7 << 2) >>
                         (*(byte *)((long)(td->mb).e_mbd.plane[0].pre + lVar40 + -0x28) & 0x1f));
          bVar46 = (byte)(((uint)bVar8 << 2) >>
                         (*(byte *)((long)(td->mb).e_mbd.plane[0].pre + lVar40 + -0x2c) & 0x1f));
          if (bVar46 < 5) {
            bVar46 = 4;
          }
          *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar40 + 0x90) = bVar46;
          if (bVar42 < 5) {
            bVar42 = 4;
          }
          *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar40 + 0x91) = bVar42;
          lVar40 = lVar40 + 0xa30;
        } while (lVar28 != lVar40);
        puVar2 = &(*(td->mb).e_mbd.mi)->field_0xa7;
        *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfff8;
        pMVar44 = *(td->mb).e_mbd.mi;
        (td->mb).e_mbd.lossless[*(ushort *)&pMVar44->field_0xa7 & 7] = local_a8;
        pMVar44->mode = '\0';
        pMVar44->tx_size = '\0';
        if ((local_1a0->sf).fp_sf.disable_recon == 0) {
          av1_encode_intra_block_plane(local_1a0,&td->mb,BVar21,0,'\x01','\0');
          cpi = pAVar20;
        }
        else {
          iVar51 = (td->mb).e_mbd.plane[0].dst.stride;
          puVar41 = (uint16_t *)(td->mb).plane[0].src.buf;
          puVar38 = (uint16_t *)(td->mb).e_mbd.plane[0].dst.buf;
          iVar49 = (td->mb).plane[0].src.stride;
          unscaled_last_source_buf_2d.buf = (uint8_t *)pSVar10;
          unscaled_last_source_buf_2d.buf0 = (uint8_t *)td;
          av1_foreach_transformed_block_in_plane
                    (local_e0,av1_ss_size_lookup[uVar35][(td->mb).e_mbd.plane[0].subsampling_x]
                              [(td->mb).e_mbd.plane[0].subsampling_y],0,
                     first_pass_intra_pred_and_calc_diff,&unscaled_last_source_buf_2d);
          if (pSVar10->use_highbitdepth == '\0') {
            pp_Var32 = (_func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **)
                       &aom_convolve_copy;
          }
          else {
            puVar41 = (uint16_t *)((long)puVar41 * 2);
            puVar38 = (uint16_t *)((long)puVar38 * 2);
            pp_Var32 = &aom_highbd_convolve_copy;
          }
          (**pp_Var32)(puVar41,(long)iVar49,puVar38,(long)iVar51,(int)block_size_wide[uVar35],
                       (int)block_size_high[uVar35]);
          cpi = local_1a0;
        }
        uVar25 = aom_get_mb_ss_sse2((td->mb).plane[0].src_diff);
        if ((pSVar10->use_highbitdepth == '\0') || (aVar9 = pSVar10->bit_depth, aVar9 == AOM_BITS_8)
           ) {
LAB_001c7389:
          if ((int)uVar25 < 0x32) {
            local_198->intra_skip_count = local_198->intra_skip_count + 1;
          }
          else if ((0 < iVar48) && (local_198->image_data_start_row == -1)) {
            local_198->image_data_start_row = unit_row;
          }
          dVar53 = log1p((double)(int)uVar25);
          if (10.0 <= dVar53) {
            dVar56 = local_198->intra_factor + 1.0;
          }
          else {
            dVar56 = (10.0 - dVar53) * 0.05 + 1.0 + local_198->intra_factor;
          }
          local_198->intra_factor = dVar56;
          if (pSVar10->use_highbitdepth == '\0') {
            uVar26 = (uint)*(td->mb).plane[0].src.buf;
          }
          else {
            uVar54 = *(ushort *)((long)(td->mb).plane[0].src.buf * 2);
            uVar26 = (uint)uVar54;
            aVar9 = pSVar10->bit_depth;
            if (aVar9 != AOM_BITS_8) {
              if (aVar9 == AOM_BITS_12) {
                uVar26 = (uint)(uVar54 >> 4);
              }
              else {
                iVar51 = -1;
                if (aVar9 != AOM_BITS_10) goto LAB_001c74e5;
                uVar26 = (uint)(uVar54 >> 2);
              }
            }
          }
          if ((9.0 <= dVar53) || (0x3f < uVar26)) {
            dVar53 = local_198->brightness_factor + 1.0;
          }
          else {
            dVar53 = (double)(int)(0x40 - uVar26) * 0.01 + 1.0 + local_198->brightness_factor;
          }
          local_198->brightness_factor = dVar53;
          iVar51 = uVar25 + 0x400;
          local_198->intra_error = (long)(int)uVar25 + local_198->intra_error + 0x400;
          if ((cpi->oxcf).q_cfg.deltaq_mode == '\x02') {
            iVar33 = av1_haar_ac_sad_mxn_uint8_input
                               ((td->mb).plane[0].src.buf,(td->mb).plane[0].src.stride,
                                (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1,local_c0,local_190);
            local_198->frame_avg_wavelet_energy = local_198->frame_avg_wavelet_energy + iVar33;
          }
          else {
            local_198->frame_avg_wavelet_energy = -1;
          }
        }
        else {
          if (aVar9 == AOM_BITS_12) {
            uVar25 = (int)uVar25 >> 8;
            goto LAB_001c7389;
          }
          iVar51 = -1;
          if (aVar9 == AOM_BITS_10) {
            uVar25 = (int)uVar25 >> 4;
            goto LAB_001c7389;
          }
        }
LAB_001c74e5:
        auVar57 = local_f8;
        if (((local_90->current_frame).frame_type & 0xfd) == 0) {
          auVar57._0_8_ = (long)iVar51;
          auVar57._8_4_ = iVar51;
          auVar57._12_4_ = iVar51 >> 0x1f;
          local_198->coded_error = auVar57._0_8_ + local_198->coded_error;
          local_198->sr_coded_error = auVar57._8_8_ + local_198->sr_coded_error;
          pFVar52 = (FRAME_STATS *)(ulong)(uint)local_180;
        }
        else {
          local_114.row = local_f8._0_2_;
          local_114.col = local_f8._2_2_;
          uVar25 = (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1;
          iVar49 = (td->mb).e_mbd.bd;
          local_f8 = auVar57;
          BVar21 = get_bsize(mi_params,fp_block_size,unit_row,iVar48);
          pbVar1 = local_a0;
          iVar27 = (cpi->common).mi_params.mb_rows;
          iVar47 = (cpi->common).mi_params.mb_cols;
          local_b0 = iVar27 << ((byte)local_b8 & 0x1f);
          if ((local_60 & 1) != 0) {
            local_b0 = iVar27 >> ((byte)local_18c & 0x1f);
          }
          local_ac = iVar47 << ((byte)local_b4 & 0x1f);
          if ((local_68 & 1) != 0) {
            local_ac = iVar47 >> (bVar4 - 2 & 0x1f);
          }
          mv.row = 0;
          mv.col = 0;
          (td->mb).e_mbd.plane[0].pre[0].buf = (local_108->field_5).buffers[0] + local_c8;
          iVar27 = (cpi->oxcf).border_in_pixels;
          iVar36 = 8 - (iVar27 + mi_col * 4);
          iVar47 = (mi_col + (int)local_70) * -4 + -8;
          if (iVar47 < iVar36) {
            iVar47 = iVar36;
          }
          (td->mb).mv_limits.col_min = iVar47;
          iVar36 = (cpi->common).mi_params.mi_cols - mi_col;
          iVar47 = iVar27 + (iVar36 - (int)local_70) * 4 + -8;
          iVar27 = iVar36 * 4 + 8;
          if (iVar47 < iVar27) {
            iVar27 = iVar47;
          }
          (td->mb).mv_limits.col_max = iVar27;
          motion_error = get_prediction_error_bitdepth(uVar25,iVar49,BVar21,local_a0,local_d0);
          unscaled_last_source_buf_2d.buf =
               (cpi->unscaled_last_source->field_5).buffers[0] + local_184;
          unscaled_last_source_buf_2d.stride = (cpi->unscaled_last_source->field_4).field_0.y_stride
          ;
          local_f8._0_4_ = iVar49;
          iVar49 = get_prediction_error_bitdepth
                             (uVar25,iVar49,BVar21,pbVar1,&unscaled_last_source_buf_2d);
          pAVar20 = local_1a0;
          local_58[local_124] = iVar49;
          if ((((cpi->sf).fp_sf.skip_motion_search_threshold < iVar49) &&
              (first_pass_motion_search(local_1a0,&td->mb,&local_114,&mv,&motion_error),
              (pAVar20->sf).fp_sf.skip_zeromv_motion_search == 0)) && (local_114 != (MV)0x0)) {
            gf_motion_error = 0;
            tmp_err = 0x7fffffff;
            first_pass_motion_search
                      (local_1a0,&td->mb,&kZeroMv,(FULLPEL_MV *)&gf_motion_error,&tmp_err);
            if (tmp_err < motion_error) {
              motion_error = tmp_err;
              mv.row = (undefined2)gf_motion_error;
              mv.col = gf_motion_error._2_2_;
            }
          }
          iVar49 = motion_error;
          gf_motion_error = motion_error;
          if ((local_100 != (YV12_BUFFER_CONFIG *)0x0) &&
             (1 < (local_1a0->common).current_frame.frame_number)) {
            tmp_err = 0;
            av1_setup_pre_planes(local_e0,0,local_100,0,0,(scale_factors *)0x0,1);
            pbVar1 = (td->mb).e_mbd.plane[0].pre;
            pbVar1->buf = pbVar1->buf + local_c8;
            gf_motion_error =
                 get_prediction_error_bitdepth(uVar25,local_f8._0_4_,BVar21,local_a0,local_d0);
            first_pass_motion_search
                      (local_1a0,&td->mb,&kZeroMv,(FULLPEL_MV *)&tmp_err,&gf_motion_error);
          }
          cpi = local_1a0;
          if ((gf_motion_error < iVar49) && (gf_motion_error < iVar51)) {
            local_198->second_ref_count = local_198->second_ref_count + 1;
          }
          iVar27 = gf_motion_error;
          if (iVar51 <= gf_motion_error) {
            iVar27 = iVar51;
          }
          if ((local_1a0->common).current_frame.frame_number < 2) {
            iVar27 = iVar49;
          }
          if (local_100 == (YV12_BUFFER_CONFIG *)0x0) {
            iVar27 = iVar49;
          }
          local_198->sr_coded_error = local_198->sr_coded_error + (long)iVar27;
          local_d0->buf = (local_108->field_5).buffers[0] + local_c8;
          pFVar52 = (FRAME_STATS *)(ulong)(uint)local_180;
          if (((local_1a0->common).seq_params)->monochrome == '\0') {
            (td->mb).e_mbd.plane[1].pre[0].buf = (local_108->field_5).buffers[1] + local_150;
            (td->mb).e_mbd.plane[2].pre[0].buf = (local_108->field_5).buffers[2] + local_150;
          }
          local_f8 = (undefined1  [16])0x0;
          if (iVar49 <= iVar51) {
            if ((iVar51 < 0x800) &&
               (iVar27 = iVar51 * 9 + -0x2400,
               iVar27 == iVar49 * 10 || SBORROW4(iVar27,iVar49 * 10) != iVar27 + iVar49 * -10 < 0))
            {
              dVar53 = local_198->neutral_count + 1.0;
LAB_001c7924:
              local_198->neutral_count = dVar53;
            }
            else if ((0x2000 < iVar51) && (iVar51 < iVar49 * 3)) {
              dVar53 = (double)iVar49 / ((double)iVar51 + 1e-06) + local_198->neutral_count;
              goto LAB_001c7924;
            }
            local_f8 = psllw(ZEXT416((uint)mv),3);
            MVar50 = local_f8._0_4_;
            pFVar52 = (FRAME_STATS *)(ulong)(uint)MVar50;
            pMVar44 = *(td->mb).e_mbd.mi;
            pMVar44->mode = '\x10';
            pMVar44->mv[0].as_int = (uint32_t)MVar50;
            pMVar44 = *(td->mb).e_mbd.mi;
            pMVar44->tx_size = '\0';
            pMVar44->ref_frame[0] = '\x01';
            (*(td->mb).e_mbd.mi)->ref_frame[1] = -1;
            if ((local_1a0->sf).fp_sf.disable_recon == 0) {
              av1_enc_build_inter_predictor
                        (local_90,local_e0,mi_row,mi_col,(BUFFER_SET *)0x0,BVar21,0,0);
              av1_encode_sby_pass1(cpi,&td->mb,BVar21);
            }
            sVar55 = local_f8._0_2_;
            sVar22 = -sVar55;
            sVar61 = local_f8._2_2_;
            sVar11 = -sVar61;
            sVar62 = local_f8._4_2_;
            sVar12 = -sVar62;
            sVar63 = local_f8._6_2_;
            sVar13 = -sVar63;
            sVar64 = local_f8._8_2_;
            sVar14 = -sVar64;
            uVar54 = (ushort)(sVar13 < sVar63) * sVar63 | (ushort)(sVar13 >= sVar63) * sVar13;
            auVar17._2_2_ = (ushort)(sVar14 < sVar64) * sVar64 | (ushort)(sVar14 >= sVar64) * sVar14
            ;
            auVar17._0_2_ = uVar54;
            auVar60._0_12_ = local_f8._0_12_;
            auVar60._12_2_ = sVar63;
            auVar60._14_2_ = sVar63;
            auVar59._12_4_ = auVar60._12_4_;
            auVar59._0_10_ = local_f8._0_10_;
            auVar59._10_2_ = sVar62;
            auVar58._10_6_ = auVar59._10_6_;
            auVar58._0_8_ = local_f8._0_8_;
            auVar58._8_2_ = sVar62;
            auVar15._4_8_ = auVar58._8_8_;
            auVar15._2_2_ = sVar61;
            auVar15._0_2_ = sVar61;
            iVar51 = (int)sVar55;
            iVar27 = auVar15._0_4_ >> 0x10;
            auVar17._4_8_ = 0;
            auVar18._12_2_ = uVar54;
            auVar18._0_12_ = auVar17 << 0x30;
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 CONCAT44(auVar18._10_4_,
                          CONCAT22((ushort)(sVar12 < sVar62) * sVar62 |
                                   (ushort)(sVar12 >= sVar62) * sVar12,uVar54)) >> 0x10;
            auVar16._2_10_ = SUB1610(auVar19 << 0x40,6);
            auVar16._0_2_ = (ushort)(sVar11 < sVar61) * sVar61 | (ushort)(sVar11 >= sVar61) * sVar11
            ;
            local_198->sum_mvr = iVar51 + local_198->sum_mvr;
            local_198->sum_mvc = iVar27 + local_198->sum_mvc;
            local_198->sum_mvr_abs =
                 (uint)(ushort)((ushort)(sVar22 < sVar55) * sVar55 |
                               (ushort)(sVar22 >= sVar55) * sVar22) + local_198->sum_mvr_abs;
            local_198->sum_mvc_abs = auVar16._0_4_ + local_198->sum_mvc_abs;
            local_198->sum_mvrs = local_198->sum_mvrs + (ulong)(uint)(iVar51 * iVar51);
            local_198->sum_mvcs = local_198->sum_mvcs + (ulong)(uint)(iVar27 * iVar27);
            local_198->inter_count = local_198->inter_count + 1;
            iVar51 = iVar49;
            if (MVar50 == (MV)0x0) {
              pFVar52 = (FRAME_STATS *)(ulong)(uint)local_180;
            }
            else {
              local_198->mv_count = local_198->mv_count + 1;
              if (local_180 != MVar50) {
                local_198->new_mv_count = local_198->new_mv_count + 1;
              }
              sVar22 = mv.row;
              if (unit_row < local_b0 / 2) {
                iVar49 = -1;
                if (sVar22 < 1) {
                  if (-1 < sVar22) goto LAB_001c7a9f;
                  iVar49 = 1;
                }
LAB_001c7a9c:
                local_198->sum_in_vectors = local_198->sum_in_vectors + iVar49;
              }
              else if (local_b0 / 2 < unit_row) {
                iVar49 = 1;
                if (sVar22 < 1) {
                  if (-1 < sVar22) goto LAB_001c7a9f;
                  iVar49 = -1;
                }
                goto LAB_001c7a9c;
              }
LAB_001c7a9f:
              iVar49 = (int)mv >> 0x10;
              if (iVar48 < local_ac / 2) {
                iVar48 = -1;
                if (iVar49 < 1) {
                  if (-1 < iVar49) goto LAB_001c7adf;
                  iVar48 = 1;
                }
              }
              else {
                if (iVar48 <= local_ac / 2) goto LAB_001c7adf;
                iVar48 = 1;
                if (iVar49 < 1) {
                  if (-1 < iVar49) goto LAB_001c7adf;
                  iVar48 = -1;
                }
              }
              local_198->sum_in_vectors = local_198->sum_in_vectors + iVar48;
            }
          }
LAB_001c7adf:
          if (iVar23 == 0) {
            tile_data->firstpass_top_mv = SUB84(pFVar52,0);
          }
          local_198->coded_error = local_198->coded_error + (long)iVar51;
          local_124 = local_124 + 1;
        }
        iVar51 = local_188;
        pbVar1 = &(td->mb).plane[0].src;
        pbVar1->buf = pbVar1->buf + local_110;
        if (uVar3 == '\0') {
          pbVar1 = &(td->mb).plane[1].src;
          pbVar1->buf = pbVar1->buf + local_78;
          pbVar1 = &(td->mb).plane[2].src;
          pbVar1->buf = pbVar1->buf + local_78;
        }
        local_11c = local_11c + (int)local_110;
        local_184 = local_184 + (int)local_110;
        local_150 = local_150 + uVar24;
        local_198 = local_198 + 1;
        (*(cpi->mt_info).enc_row_mt.sync_write_ptr)(local_80,iVar34,iVar23,local_188);
        bVar45 = false;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        _Var5 = (cpi->mt_info).enc_row_mt.firstpass_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        bVar45 = true;
        if (_Var5 == false) goto LAB_001c6dc4;
      }
    } while ((!bVar45) && (iVar23 = iVar23 + 1, iVar23 != iVar51));
  }
  return;
}

Assistant:

void av1_first_pass_row(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                        const int unit_row, const BLOCK_SIZE fp_block_size) {
  MACROBLOCK *const x = &td->mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  TileInfo *tile = &tile_data->tile_info;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int fp_block_size_width = block_size_high[fp_block_size];
  const int fp_block_size_height = block_size_wide[fp_block_size];
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_width_log2 = mi_size_wide_log2[fp_block_size];
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  const int unit_cols = mi_params->mb_cols * 4 / unit_width;
  int raw_motion_err_counts = 0;
  int unit_row_in_tile = unit_row - (tile->mi_row_start >> unit_height_log2);
  int unit_col_start = tile->mi_col_start >> unit_width_log2;
  int unit_cols_in_tile = av1_get_unit_cols_in_tile(tile, fp_block_size);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;

  const YV12_BUFFER_CONFIG *last_frame =
      av1_get_scaled_ref_frame(cpi, LAST_FRAME);
  if (!last_frame) {
    last_frame = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  }
  const YV12_BUFFER_CONFIG *golden_frame =
      av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME);
  if (!golden_frame) {
    golden_frame = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }
  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;

  PICK_MODE_CONTEXT *ctx = td->firstpass_ctx;
  FRAME_STATS *mb_stats =
      cpi->firstpass_data.mb_stats + unit_row * unit_cols + unit_col_start;
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list +
                             unit_row * unit_cols + unit_col_start;
  MV *first_top_mv = &tile_data->firstpass_top_mv;

  for (int i = 0; i < num_planes; ++i) {
    x->plane[i].coeff = ctx->coeff[i];
    x->plane[i].qcoeff = ctx->qcoeff[i];
    x->plane[i].eobs = ctx->eobs[i];
    x->plane[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
    x->plane[i].dqcoeff = ctx->dqcoeff[i];
  }

  const int src_y_stride = cpi->source->y_stride;
  const int recon_y_stride = this_frame->y_stride;
  const int recon_uv_stride = this_frame->uv_stride;
  const int uv_mb_height =
      fp_block_size_height >> (this_frame->y_height > this_frame->uv_height);

  MV best_ref_mv = kZeroMv;
  MV last_mv;

  // Reset above block coeffs.
  xd->up_available = (unit_row_in_tile != 0);
  int recon_yoffset = (unit_row * recon_y_stride * fp_block_size_height) +
                      (unit_col_start * fp_block_size_width);
  int src_yoffset = (unit_row * src_y_stride * fp_block_size_height) +
                    (unit_col_start * fp_block_size_width);
  int recon_uvoffset = (unit_row * recon_uv_stride * uv_mb_height) +
                       (unit_col_start * uv_mb_height);

  // Set up limit values for motion vectors to prevent them extending
  // outside the UMV borders.
  av1_set_mv_row_limits(
      mi_params, &x->mv_limits, (unit_row << unit_height_log2),
      (fp_block_size_height >> MI_SIZE_LOG2), cpi->oxcf.border_in_pixels);

  av1_setup_src_planes(x, cpi->source, unit_row << unit_height_log2,
                       tile->mi_col_start, num_planes, fp_block_size);

  // Fix - zero the 16x16 block first. This ensures correct this_intra_error for
  // block sizes smaller than 16x16.
  av1_zero_array(x->plane[0].src_diff, 256);

  for (int unit_col_in_tile = 0; unit_col_in_tile < unit_cols_in_tile;
       unit_col_in_tile++) {
    const int unit_col = unit_col_start + unit_col_in_tile;

    enc_row_mt->sync_read_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile);

#if CONFIG_MULTITHREAD
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      pthread_mutex_lock(enc_row_mt->mutex_);
      bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
      pthread_mutex_unlock(enc_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (firstpass_mt_exit) return;
    }
#endif

    if (unit_col_in_tile == 0) {
      last_mv = *first_top_mv;
    }
    int this_intra_error = firstpass_intra_prediction(
        cpi, td, this_frame, tile, unit_row, unit_col, recon_yoffset,
        recon_uvoffset, fp_block_size, qindex, mb_stats);

    if (!frame_is_intra_only(cm)) {
      const int this_inter_error = firstpass_inter_prediction(
          cpi, td, last_frame, golden_frame, unit_row, unit_col, recon_yoffset,
          recon_uvoffset, src_yoffset, fp_block_size, this_intra_error,
          raw_motion_err_counts, raw_motion_err_list, best_ref_mv, &best_ref_mv,
          &last_mv, mb_stats);
      if (unit_col_in_tile == 0) {
        *first_top_mv = last_mv;
      }
      mb_stats->coded_error += this_inter_error;
      ++raw_motion_err_counts;
    } else {
      mb_stats->sr_coded_error += this_intra_error;
      mb_stats->coded_error += this_intra_error;
    }

    // Adjust to the next column of MBs.
    x->plane[0].src.buf += fp_block_size_width;
    if (num_planes > 1) {
      x->plane[1].src.buf += uv_mb_height;
      x->plane[2].src.buf += uv_mb_height;
    }

    recon_yoffset += fp_block_size_width;
    src_yoffset += fp_block_size_width;
    recon_uvoffset += uv_mb_height;
    mb_stats++;

    enc_row_mt->sync_write_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile,
                               unit_cols_in_tile);
  }
}